

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_column_writer.cpp
# Opt level: O0

void __thiscall
duckdb::EnumColumnWriter::WriteVector
          (EnumColumnWriter *this,WriteStream *temp_writer,ColumnWriterStatistics *stats_p,
          ColumnWriterPageState *page_state_p,Vector *input_column,idx_t chunk_start,idx_t chunk_end
          )

{
  PhysicalType PVar1;
  LogicalType *this_00;
  InternalException *this_01;
  ColumnWriter *in_RDI;
  EnumWriterPageState *page_state;
  ColumnWriterPageState *in_stack_ffffffffffffff80;
  allocator *paVar2;
  EnumWriterPageState *in_stack_ffffffffffffff98;
  idx_t in_stack_ffffffffffffffa0;
  idx_t in_stack_ffffffffffffffa8;
  Vector *in_stack_ffffffffffffffb0;
  WriteStream *in_stack_ffffffffffffffb8;
  EnumColumnWriter *in_stack_ffffffffffffffc0;
  
  ColumnWriterPageState::Cast<duckdb::EnumWriterPageState>(in_stack_ffffffffffffff80);
  this_00 = ColumnWriter::Type(in_RDI);
  PVar1 = LogicalType::InternalType(this_00);
  if (PVar1 == UINT8) {
    WriteEnumInternal<unsigned_char>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  else if (PVar1 == UINT16) {
    WriteEnumInternal<unsigned_short>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  else {
    if (PVar1 != UINT32) {
      this_01 = (InternalException *)__cxa_allocate_exception(0x10);
      paVar2 = (allocator *)&stack0xffffffffffffffa7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffffa8,"Unsupported internal enum type",paVar2);
      duckdb::InternalException::InternalException(this_01,(string *)&stack0xffffffffffffffa8);
      __cxa_throw(this_01,&InternalException::typeinfo,InternalException::~InternalException);
    }
    WriteEnumInternal<unsigned_int>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
               in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  return;
}

Assistant:

void EnumColumnWriter::WriteVector(WriteStream &temp_writer, ColumnWriterStatistics *stats_p,
                                   ColumnWriterPageState *page_state_p, Vector &input_column, idx_t chunk_start,
                                   idx_t chunk_end) {
	auto &page_state = page_state_p->Cast<EnumWriterPageState>();
	switch (Type().InternalType()) {
	case PhysicalType::UINT8:
		WriteEnumInternal<uint8_t>(temp_writer, input_column, chunk_start, chunk_end, page_state);
		break;
	case PhysicalType::UINT16:
		WriteEnumInternal<uint16_t>(temp_writer, input_column, chunk_start, chunk_end, page_state);
		break;
	case PhysicalType::UINT32:
		WriteEnumInternal<uint32_t>(temp_writer, input_column, chunk_start, chunk_end, page_state);
		break;
	default:
		throw InternalException("Unsupported internal enum type");
	}
}